

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

int __thiscall QTextDocumentPrivate::remove(QTextDocumentPrivate *this,char *__filename)

{
  long lVar1;
  bool bVar2;
  AdjustResult AVar3;
  QTextCursorPrivate **ppQVar4;
  Operation in_ECX;
  int in_EDX;
  int positionOfChange;
  long in_FS_OFFSET;
  QTextCursorPrivate *curs;
  add_const_t<QSet<QTextCursorPrivate_*>_> *__range1;
  QTextDocumentPrivate *in_stack_00000018;
  const_iterator __end1;
  const_iterator __begin1;
  QTextCursorPrivate *in_stack_ffffffffffffffb0;
  QTextDocumentPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  positionOfChange = (int)__filename;
  if (in_EDX != 0) {
    this->field_0x294 = this->field_0x294 & 0xfd | 2;
    this_00 = this;
    move(in_stack_00000018,__range1._4_4_,(int)__range1,curs._4_4_,(Operation)curs);
    this->field_0x294 = this->field_0x294 & 0xfd;
    QSet<QTextCursorPrivate_*>::begin
              ((QSet<QTextCursorPrivate_*> *)CONCAT44(positionOfChange,in_EDX));
    QSet<QTextCursorPrivate_*>::end((QSet<QTextCursorPrivate_*> *)CONCAT44(positionOfChange,in_EDX))
    ;
    while (bVar2 = QSet<QTextCursorPrivate_*>::const_iterator::operator!=
                             ((const_iterator *)in_stack_ffffffffffffffb0,(const_iterator *)this),
          bVar2) {
      ppQVar4 = QSet<QTextCursorPrivate_*>::const_iterator::operator*((const_iterator *)0x7d3c34);
      in_stack_ffffffffffffffb0 = *ppQVar4;
      AVar3 = QTextCursorPrivate::adjustPosition
                        (in_stack_ffffffffffffffb0,positionOfChange,-in_EDX,in_ECX);
      if (AVar3 == CursorMoved) {
        in_stack_ffffffffffffffb0->field_0x28 = in_stack_ffffffffffffffb0->field_0x28 & 0xfb | 4;
      }
      QSet<QTextCursorPrivate_*>::const_iterator::operator++
                ((const_iterator *)in_stack_ffffffffffffffb0);
    }
    finishEdit(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QTextDocumentPrivate::remove(int pos, int length, QTextUndoCommand::Operation op)
{
    if (length == 0)
        return;
    blockCursorAdjustment = true;
    move(pos, -1, length, op);
    blockCursorAdjustment = false;
    for (QTextCursorPrivate *curs : std::as_const(cursors)) {
        if (curs->adjustPosition(pos, -length, op) == QTextCursorPrivate::CursorMoved) {
            curs->changed = true;
        }
    }
    finishEdit();
}